

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QMessagePattern::BacktraceParams>::clear(QList<QMessagePattern::BacktraceParams> *this)

{
  long lVar1;
  Data *pDVar2;
  BacktraceParams *pBVar3;
  qsizetype capacity;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QMessagePattern::BacktraceParams> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    pDVar2 = (this->d).d;
    if (pDVar2 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        pBVar3 = (this->d).ptr;
        std::_Destroy_aux<false>::__destroy<QMessagePattern::BacktraceParams*>
                  (pBVar3,pBVar3 + lVar1);
        (this->d).size = 0;
        goto LAB_00214574;
      }
      capacity = (pDVar2->super_QArrayData).alloc;
    }
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (BacktraceParams *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pBVar3 = (BacktraceParams *)QArrayData::allocate(&local_20,0x20,0x10,capacity,KeepSize);
    local_38.d = (this->d).d;
    (this->d).d = (Data *)local_20;
    local_38.ptr = (this->d).ptr;
    (this->d).ptr = pBVar3;
    local_38.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QMessagePattern::BacktraceParams>::~QArrayDataPointer(&local_38);
  }
LAB_00214574:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }